

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initResourceFiles(VcprojGenerator *this)

{
  bool bVar1;
  ProStringList *pPVar2;
  const_iterator o;
  QString *tmp_out;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *qrc_file;
  QStringList *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList deps;
  QStringList qrc_files;
  QString rcc_dep_cmd;
  QStringList *in_stack_00000220;
  ProKey *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  QChar in_stack_fffffffffffffe5e;
  VCFilter *in_stack_fffffffffffffe60;
  VCFilter *this_00;
  char *in_stack_fffffffffffffe68;
  ProStringList *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  QString *inpf;
  QString *tmp_dep_cmd;
  ProString *in_stack_fffffffffffffeb8;
  MakefileGenerator *in_stack_fffffffffffffec0;
  const_iterator local_c0;
  ProKey local_b8;
  QString local_70;
  QChar local_52 [25];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tmp_dep_cmd = in_RDI;
  QString::operator=((QString *)
                     CONCAT26(in_stack_fffffffffffffe5e.ucs,
                              CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
                     in_stack_fffffffffffffe78);
  *(undefined4 *)&in_RDI[0x1f5].d.size = 0;
  QString::operator=((QString *)
                     CONCAT26(in_stack_fffffffffffffe5e.ucs,
                              CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
                     in_stack_fffffffffffffe78);
  QString::operator=((QString *)
                     CONCAT26(in_stack_fffffffffffffe5e.ucs,
                              CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
                     in_stack_fffffffffffffe78);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (char *)in_stack_fffffffffffffe48);
  pPVar2 = QMakeProject::values
                     ((QMakeProject *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                      in_stack_fffffffffffffe48);
  QChar::QChar<char,_true>(local_52,' ');
  ProStringList::join((ProStringList *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe5e);
  ProKey::~ProKey((ProKey *)0x293207);
  bVar1 = QString::isEmpty((QString *)0x293214);
  if (!bVar1) {
    local_70.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_70.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_70.d.size = -0x5555555555555556;
    ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (char *)in_stack_fffffffffffffe48);
    QMakeProject::values
              ((QMakeProject *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48);
    ProStringList::toQStringList(in_stack_fffffffffffffe70);
    ProKey::~ProKey((ProKey *)0x29329d);
    local_b8.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_b8.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_b8.super_ProString.m_string.d.size = -0x5555555555555556;
    QList<QString>::QList((QList<QString> *)0x2932d7);
    inpf = &local_70;
    local_c0.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_c0 = QList<QString>::begin
                         ((QList<QString> *)
                          CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    o = QList<QString>::end((QList<QString> *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    while( true ) {
      bVar1 = QList<QString>::const_iterator::operator!=(&local_c0,o);
      if (!bVar1) break;
      tmp_out = QList<QString>::const_iterator::operator*(&local_c0);
      ProString::ProString
                ((ProString *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe68);
      QString::QString((QString *)0x2933af);
      in_stack_fffffffffffffe48 = &local_b8;
      in_stack_fffffffffffffe50 = 0;
      in_stack_fffffffffffffe58 = 1;
      MakefileGenerator::callExtraCompilerDependCommand
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,tmp_dep_cmd,inpf,tmp_out,
                 SUB81((ulong)pPVar2 >> 0x38,0),in_stack_00000220,SUB81((ulong)pPVar2 >> 0x30,0),
                 SUB81((ulong)pPVar2 >> 0x28,0));
      QString::~QString((QString *)0x293408);
      ProString::~ProString((ProString *)0x293415);
      QList<QString>::const_iterator::operator++(&local_c0);
    }
    VCFilter::addFiles(in_stack_fffffffffffffe60,
                       (QStringList *)
                       CONCAT26(in_stack_fffffffffffffe5e.ucs,
                                CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
    QList<QString>::~QList((QList<QString> *)0x293454);
    QList<QString>::~QList((QList<QString> *)0x293461);
  }
  this_00 = (VCFilter *)in_RDI[9].d.d;
  ProKey::ProKey((ProKey *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (char *)in_stack_fffffffffffffe48);
  QMakeProject::values
            ((QMakeProject *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  VCFilter::addFiles(this_00,(ProStringList *)
                             CONCAT26(in_stack_fffffffffffffe5e.ucs,
                                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
                    );
  ProKey::~ProKey((ProKey *)0x2934bd);
  in_RDI[0x1f6].d.d = (Data *)in_RDI;
  in_RDI[0x1f6].d.ptr = (char16_t *)&in_RDI[0x19].d.size;
  QString::~QString((QString *)0x2934e7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initResourceFiles()
{
    vcProject.ResourceFiles.Name = "Resource Files";
    vcProject.ResourceFiles.ParseFiles = _False;
    vcProject.ResourceFiles.Filter = "qrc;*"; //"rc;ico;cur;bmp;dlg;rc2;rct;bin;rgs;gif;jpg;jpeg;jpe;resx;ts;xlf;qrc";
    vcProject.ResourceFiles.Guid = _GUIDResourceFiles;

    // Bad hack, please look away -------------------------------------
    QString rcc_dep_cmd = project->values("rcc.depend_command").join(' ');
    if(!rcc_dep_cmd.isEmpty()) {
        const QStringList qrc_files = project->values("RESOURCES").toQStringList();
        QStringList deps;
        for (const QString &qrc_file : qrc_files) {
            callExtraCompilerDependCommand("rcc",
                                           rcc_dep_cmd,
                                           qrc_file,
                                           QString(),
                                           true,  // dep_lines
                                           &deps,
                                           false, // existingDepsOnly
                                           true   // checkCommandavailability
                                          );
        }
        vcProject.ResourceFiles.addFiles(deps);
    }
    // You may look again --------------------------------------------

    vcProject.ResourceFiles.addFiles(project->values("RESOURCES"));

    vcProject.ResourceFiles.Project = this;
    vcProject.ResourceFiles.Config = &(vcProject.Configuration);
}